

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O3

ssh_rportfwd *
ssh2_rportfwd_alloc(ConnectionLayer *cl,char *shost,int sport,char *dhost,int dport,
                   int addressfamily,char *log_description,PortFwdRecord *pfr,
                   ssh_sharing_connstate *share_ctx)

{
  BinarySink *bs;
  ssh_rportfwd *rpf;
  LogContext *pLVar1;
  char *pcVar2;
  ssh_rportfwd *psVar3;
  long lVar4;
  
  rpf = (ssh_rportfwd *)safemalloc(1,0x38,0);
  if (cl[-6].logctx == (LogContext *)0x0) {
    pLVar1 = (LogContext *)newtree234(ssh2_rportfwd_cmp);
    cl[-6].logctx = pLVar1;
  }
  pcVar2 = dupstr(shost);
  rpf->shost = pcVar2;
  rpf->sport = sport;
  pcVar2 = dupstr(dhost);
  rpf->dhost = pcVar2;
  rpf->dport = dport;
  rpf->addressfamily = addressfamily;
  pcVar2 = dupstr(log_description);
  rpf->log_description = pcVar2;
  rpf->pfr = pfr;
  rpf->share_ctx = share_ctx;
  psVar3 = (ssh_rportfwd *)add234((tree234 *)cl[-6].logctx,rpf);
  if (psVar3 == rpf) {
    if (rpf->share_ctx == (ssh_sharing_connstate *)0x0) {
      lVar4 = (**(code **)((cl[1].vt)->rportfwd_alloc + 0x18))(0x50);
      bs = (BinarySink *)(lVar4 + 0x60);
      BinarySink_put_stringz(bs,"tcpip-forward");
      BinarySink_put_bool(bs,true);
      BinarySink_put_stringz(bs,rpf->shost);
      BinarySink_put_uint32(bs,(ulong)rpf->sport);
      pq_base_push((PacketQueueBase *)cl[2].vt,(PacketQueueNode *)(lVar4 + 0x40));
      ssh2_queue_global_request_handler
                ((ssh2_connection_state *)&cl[-0xe].vt,ssh2_rportfwd_globreq_response,rpf);
    }
  }
  else {
    free_rportfwd(rpf);
    rpf = (ssh_rportfwd *)0x0;
  }
  return rpf;
}

Assistant:

struct ssh_rportfwd *ssh2_rportfwd_alloc(
    ConnectionLayer *cl,
    const char *shost, int sport, const char *dhost, int dport,
    int addressfamily, const char *log_description, PortFwdRecord *pfr,
    ssh_sharing_connstate *share_ctx)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);
    struct ssh_rportfwd *rpf = snew(struct ssh_rportfwd);

    if (!s->rportfwds)
        s->rportfwds = newtree234(ssh2_rportfwd_cmp);

    rpf->shost = dupstr(shost);
    rpf->sport = sport;
    rpf->dhost = dupstr(dhost);
    rpf->dport = dport;
    rpf->addressfamily = addressfamily;
    rpf->log_description = dupstr(log_description);
    rpf->pfr = pfr;
    rpf->share_ctx = share_ctx;

    if (add234(s->rportfwds, rpf) != rpf) {
        free_rportfwd(rpf);
        return NULL;
    }

    if (!rpf->share_ctx) {
        PktOut *pktout = ssh_bpp_new_pktout(
            s->ppl.bpp, SSH2_MSG_GLOBAL_REQUEST);
        put_stringz(pktout, "tcpip-forward");
        put_bool(pktout, true);       /* want reply */
        put_stringz(pktout, rpf->shost);
        put_uint32(pktout, rpf->sport);
        pq_push(s->ppl.out_pq, pktout);

        ssh2_queue_global_request_handler(
            s, ssh2_rportfwd_globreq_response, rpf);
    }

    return rpf;
}